

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTableInfo::DataTableInfo
          (DataTableInfo *this,AttachedDatabase *db,
          shared_ptr<duckdb::TableIOManager,_true> *table_io_manager_p,string *schema,string *table)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  
  this->db = db;
  (this->table_io_manager).internal.
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (table_io_manager_p->internal).
           super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (table_io_manager_p->internal).
           super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (table_io_manager_p->internal).
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->table_io_manager).internal.
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->table_io_manager).internal.
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var5;
  (table_io_manager_p->internal).
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->name_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->name_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->name_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->name_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->name_lock).super___mutex_base._M_mutex + 8) = 0;
  paVar1 = &(this->schema).field_2;
  (this->schema)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (schema->_M_dataplus)._M_p;
  paVar2 = &schema->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&schema->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->schema).field_2 + 8) = uVar6;
  }
  else {
    (this->schema)._M_dataplus._M_p = pcVar3;
    (this->schema).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->schema)._M_string_length = schema->_M_string_length;
  (schema->_M_dataplus)._M_p = (pointer)paVar2;
  schema->_M_string_length = 0;
  (schema->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->table).field_2;
  (this->table)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table->_M_dataplus)._M_p;
  paVar2 = &table->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&table->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table).field_2 + 8) = uVar6;
  }
  else {
    (this->table)._M_dataplus._M_p = pcVar3;
    (this->table).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table)._M_string_length = table->_M_string_length;
  (table->_M_dataplus)._M_p = (pointer)paVar2;
  table->_M_string_length = 0;
  (table->field_2)._M_local_buf[0] = '\0';
  (this->index_storage_infos).
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index_storage_infos).
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index_storage_infos).
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indexes).indexes_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->indexes).indexes_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->indexes).indexes_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->indexes).indexes_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->indexes).indexes_lock.super___mutex_base._M_mutex + 8) = 0;
  StorageLock::StorageLock(&this->checkpoint_lock);
  return;
}

Assistant:

DataTableInfo::DataTableInfo(AttachedDatabase &db, shared_ptr<TableIOManager> table_io_manager_p, string schema,
                             string table)
    : db(db), table_io_manager(std::move(table_io_manager_p)), schema(std::move(schema)), table(std::move(table)) {
}